

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

bool __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
::getPosition<Kernel::TermList::Top>
          (SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListIntermediateNode::NodePtrComparator>
           *this,Top key,Node ***pvalue,bool canCreate)

{
  Top key_00;
  bool bVar1;
  Comparison CVar2;
  Node *pNVar3;
  Node *pNVar4;
  uint uVar5;
  Top key_01;
  Top local_48;
  Node ***local_38;
  
  key_01._inner._inner._0_8_ = key._inner._inner._0_8_;
  local_48._inner._inner._content[7] = key._inner._inner._content[7];
  *pvalue = (Node **)0x0;
  local_48._inner._inner._0_8_ = key_01._inner._inner._0_8_;
  if (this->_top == 0) {
    if (!canCreate) {
      return false;
    }
    key_01._inner._inner._8_4_ = key._inner._inner._8_4_ & 0xff;
    pNVar3 = (Node *)insertPosition<Kernel::TermList::Top>(this,key_01);
    bVar1 = false;
  }
  else {
    uVar5 = this->_top - 1;
    pNVar3 = this->_left;
    local_38 = pvalue;
LAB_002a8c8d:
    pNVar4 = pNVar3;
    do {
      pNVar3 = pNVar4->nodes[uVar5];
      if (pNVar3 == (Node *)0x0) break;
      CVar2 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
              SListIntermediateNode::NodePtrComparator::compare(&local_48,pNVar3->value);
      if (CVar2 == GREATER) goto LAB_002a8c8d;
      if (CVar2 == EQUAL) {
        bVar1 = true;
        pvalue = local_38;
        goto LAB_002a8ce1;
      }
    } while (CVar2 != LESS);
    if (uVar5 != 0) {
      uVar5 = uVar5 - 1;
      pNVar3 = pNVar4;
      goto LAB_002a8c8d;
    }
    if (!canCreate) {
      return false;
    }
    key_00._inner._inner._content[7] = local_48._inner._inner._content[7];
    key_00._inner._inner._9_3_ = local_48._inner._inner._9_3_;
    key_00._inner._inner._0_1_ = local_48._inner._inner._0_1_;
    key_00._inner._inner._content[0] = local_48._inner._inner._content[0];
    key_00._inner._inner._content[1] = local_48._inner._inner._content[1];
    key_00._inner._inner._content[2] = local_48._inner._inner._content[2];
    key_00._inner._inner._content[3] = local_48._inner._inner._content[3];
    key_00._inner._inner._content[4] = local_48._inner._inner._content[4];
    key_00._inner._inner._content[5] = local_48._inner._inner._content[5];
    key_00._inner._inner._content[6] = local_48._inner._inner._content[6];
    pNVar3 = (Node *)insertPosition<Kernel::TermList::Top>(this,key_00);
    bVar1 = false;
    pvalue = local_38;
  }
LAB_002a8ce1:
  *pvalue = &pNVar3->value;
  return bVar1;
}

Assistant:

bool getPosition(Key key, Value*& pvalue, bool canCreate)
  {
    pvalue = nullptr;

    if(_top==0) {
      if(canCreate) {
	pvalue = insertPosition(key);
      }
      return false;
    }

    unsigned h = _top-1;

   // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if (h == 0) {
	    if(canCreate) {
	      pvalue=insertPosition(key);
	    }
	    return false;
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if (h == 0) {
	    if(canCreate) {
	      pvalue=insertPosition(key);
	    }
	    return false;
	  }
	  h--;
	  break;

	case EQUAL:
	  pvalue=&next->value;
	  return true;

	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }